

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborValueRef
QCborContainerPrivate::findOrAddMapKey<QStringView>(QCborValueRef self,QStringView key)

{
  pointer array;
  pointer pEVar1;
  storage_type_conflict *psVar2;
  QStringView key_00;
  QCborValueConstRef QVar3;
  
  psVar2 = key.m_data;
  pEVar1 = QList<QtCbor::Element>::data(&(self.super_QCborValueConstRef.d)->elements);
  array = pEVar1 + self.super_QCborValueConstRef.i;
  if (pEVar1[self.super_QCborValueConstRef.i].type != Map) {
    if (pEVar1[self.super_QCborValueConstRef.i].type == Array) {
      convertArrayToMap((QCborContainerPrivate **)array);
    }
    else {
      if (((array->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
        deref((array->field_0).container);
      }
      (array->field_0).value = 0;
    }
  }
  array->type = Map;
  array->flags = (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)0x1;
  key_00.m_data = psVar2;
  key_00.m_size = (qsizetype)key.m_data;
  QVar3 = (QCborValueConstRef)
          findOrAddMapKey<QStringView>
                    ((array->field_0).container,(QCborContainerPrivate *)key.m_size,key_00);
  assignContainer((QCborContainerPrivate **)array,QVar3.d);
  return (QCborValueRef)QVar3;
}

Assistant:

QCborValueRef
QCborContainerPrivate::findOrAddMapKey(QCborValueRef self, KeyType key)
{
    auto &e = self.d->elements[self.i];

    // we need a map, so convert if necessary
    if (e.type == QCborValue::Array) {
        convertArrayToMap(e.container);
    } else if (e.type != QCborValue::Map) {
        if (e.flags & QtCbor::Element::IsContainer)
            e.container->deref();
        e.container = nullptr;
    }
    e.flags = QtCbor::Element::IsContainer;
    e.type = QCborValue::Map;

    QCborValueRef result = findOrAddMapKey<KeyType>(e.container, key);
    assignContainer(e.container, result.d);
    return result;
}